

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::
     DumpReg2U<Js::OpLayoutT_Reg2U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCode op,OpLayoutT_Reg2U<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  FunctionProxy *this;
  ParseableFunctionInfo *pPVar4;
  undefined4 extraout_var;
  undefined6 in_register_0000003a;
  
  if ((int)CONCAT62(in_register_0000003a,op) == 0x162) {
    this = ParseableFunctionInfo::GetNestedFunctionProxy
                     (&dumpFunction->super_ParseableFunctionInfo,(uint)data->SlotIndex);
    bVar1 = data->R0;
    bVar2 = data->R1;
    pPVar4 = FunctionProxy::EnsureDeserialized(this);
    iVar3 = (*(pPVar4->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(pPVar4);
    Output::Print(L" R%d, R%d = %s()",(ulong)bVar1,(ulong)bVar2,CONCAT44(extraout_var,iVar3));
    return;
  }
  Output::Print(L" R%d ",(ulong)data->R0);
  Output::Print(L" R%d ",(ulong)data->R1);
  return;
}

Assistant:

void
    ByteCodeDumper::DumpReg2U(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case Js::OpCode::InitBaseClass:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d, R%d = %s()"), data->R0, data->R1, pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }

            default:
                DumpReg(data->R0);
                DumpReg(data->R1);
                break;
        }
    }